

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ExtensionDescriptorTest_IsExtensionNumber_Test::
ExtensionDescriptorTest_IsExtensionNumber_Test(ExtensionDescriptorTest_IsExtensionNumber_Test *this)

{
  ExtensionDescriptorTest_IsExtensionNumber_Test *this_local;
  
  ExtensionDescriptorTest::ExtensionDescriptorTest(&this->super_ExtensionDescriptorTest);
  (this->super_ExtensionDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ExtensionDescriptorTest_IsExtensionNumber_Test_029a6ee0;
  return;
}

Assistant:

TEST_F(ExtensionDescriptorTest, IsExtensionNumber) {
  EXPECT_FALSE(foo_->IsExtensionNumber(9));
  EXPECT_TRUE(foo_->IsExtensionNumber(10));
  EXPECT_TRUE(foo_->IsExtensionNumber(19));
  EXPECT_FALSE(foo_->IsExtensionNumber(20));
  EXPECT_FALSE(foo_->IsExtensionNumber(29));
  EXPECT_TRUE(foo_->IsExtensionNumber(30));
  EXPECT_TRUE(foo_->IsExtensionNumber(39));
  EXPECT_FALSE(foo_->IsExtensionNumber(40));
}